

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixSync(unqlite_file *id,int flags)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = fdatasync(*(int *)&id[2].pMethods);
  if (iVar1 != -1) {
    iVar1 = *(int *)((long)&id[2].pMethods + 4);
    if (iVar1 < 0) {
      return 0;
    }
    fdatasync(iVar1);
    iVar1 = close(*(int *)((long)&id[2].pMethods + 4));
    if (iVar1 == 0) {
      *(undefined4 *)((long)&id[2].pMethods + 4) = 0xffffffff;
      return 0;
    }
  }
  piVar2 = __errno_location();
  *(int *)((long)&id[3].pMethods + 4) = *piVar2;
  return -2;
}

Assistant:

static int unixSync(unqlite_file *id, int flags){
  int rc;
  unixFile *pFile = (unixFile*)id;

  int isDataOnly = (flags&UNQLITE_SYNC_DATAONLY);
  int isFullsync = (flags&0x0F)==UNQLITE_SYNC_FULL;

  rc = full_fsync(pFile->h, isFullsync, isDataOnly);

  if( rc ){
    pFile->lastErrno = errno;
    return UNQLITE_IOERR;
  }
  if( pFile->dirfd>=0 ){
    int err;
#ifndef UNQLITE_DISABLE_DIRSYNC
    /* The directory sync is only attempted if full_fsync is
    ** turned off or unavailable.  If a full_fsync occurred above,
    ** then the directory sync is superfluous.
    */
    if( (!HAVE_FULLFSYNC || !isFullsync) && full_fsync(pFile->dirfd,0,0) ){
       /*
       ** We have received multiple reports of fsync() returning
       ** errors when applied to directories on certain file systems.
       ** A failed directory sync is not a big deal.  So it seems
       ** better to ignore the error.  Ticket #1657
       */
       /* pFile->lastErrno = errno; */
       /* return UNQLITE_IOERR; */
    }
#endif
    err = close(pFile->dirfd); /* Only need to sync once, so close the */
    if( err==0 ){              /* directory when we are done */
      pFile->dirfd = -1;
    }else{
      pFile->lastErrno = errno;
      rc = UNQLITE_IOERR;
    }
  }
  return rc;
}